

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::IsValidStorageClass
          (ValidationState_t *this,StorageClass storage_class)

{
  bool bVar1;
  spv_const_context psVar2;
  StorageClass storage_class_local;
  ValidationState_t *this_local;
  
  psVar2 = context(this);
  bVar1 = spvIsVulkanEnv(psVar2->target_env);
  if (bVar1) {
    if ((((((storage_class < CrossWorkgroup) || (storage_class - Private < 2)) ||
          (storage_class == PushConstant)) ||
         ((storage_class - Image < 2 || (storage_class == StorageClassTileImageEXT)))) ||
        ((storage_class - CallableDataKHR < 2 ||
         ((storage_class - RayPayloadKHR < 2 || (storage_class - IncomingRayPayloadKHR < 2)))))) ||
       ((storage_class == PhysicalStorageBuffer ||
        ((storage_class == HitObjectAttributeNV ||
         (storage_class == StorageClassTaskPayloadWorkgroupEXT)))))) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::IsValidStorageClass(
    spv::StorageClass storage_class) const {
  if (spvIsVulkanEnv(context()->target_env)) {
    switch (storage_class) {
      case spv::StorageClass::UniformConstant:
      case spv::StorageClass::Uniform:
      case spv::StorageClass::StorageBuffer:
      case spv::StorageClass::Input:
      case spv::StorageClass::Output:
      case spv::StorageClass::Image:
      case spv::StorageClass::Workgroup:
      case spv::StorageClass::Private:
      case spv::StorageClass::Function:
      case spv::StorageClass::PushConstant:
      case spv::StorageClass::PhysicalStorageBuffer:
      case spv::StorageClass::RayPayloadKHR:
      case spv::StorageClass::IncomingRayPayloadKHR:
      case spv::StorageClass::HitAttributeKHR:
      case spv::StorageClass::CallableDataKHR:
      case spv::StorageClass::IncomingCallableDataKHR:
      case spv::StorageClass::ShaderRecordBufferKHR:
      case spv::StorageClass::TaskPayloadWorkgroupEXT:
      case spv::StorageClass::HitObjectAttributeNV:
      case spv::StorageClass::TileImageEXT:
        return true;
      default:
        return false;
    }
  }

  return true;
}